

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

int __thiscall
zmq::socket_base_t::setsockopt
          (socket_base_t *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  mutex_t *mutex_;
  scoped_optional_lock_t sync_lock;
  
  mutex_ = (mutex_t *)0x0;
  if (this->_thread_safe != false) {
    mutex_ = &this->_sync;
  }
  scoped_optional_lock_t::scoped_optional_lock_t(&sync_lock,mutex_);
  if (this->_ctx_terminated == true) {
    piVar2 = __errno_location();
    *piVar2 = 0x9523dfd;
    iVar1 = -1;
  }
  else {
    iVar1 = (*(this->super_own_t).super_object_t._vptr_object_t[0x21])
                      (this,__fd,CONCAT44(in_register_00000014,__level),
                       CONCAT44(in_register_0000000c,__optname));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0x16) {
        iVar1 = options_t::setsockopt
                          (&(this->super_own_t).options,__fd,__level,__optname,__optval,__optlen);
        update_pipe_options(this,__fd);
      }
    }
  }
  scoped_optional_lock_t::~scoped_optional_lock_t(&sync_lock);
  return iVar1;
}

Assistant:

int zmq::socket_base_t::setsockopt (int option_,
                                    const void *optval_,
                                    size_t optvallen_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  First, check whether specific socket type overloads the option.
    int rc = xsetsockopt (option_, optval_, optvallen_);
    if (rc == 0 || errno != EINVAL) {
        return rc;
    }

    //  If the socket type doesn't support the option, pass it to
    //  the generic option parser.
    rc = options.setsockopt (option_, optval_, optvallen_);
    update_pipe_options (option_);

    return rc;
}